

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_add.cxx
# Opt level: O2

int __thiscall
Fl_Menu_::insert(Fl_Menu_ *this,int index,char *label,int shortcut,Fl_Callback *callback,
                void *userdata,int flags)

{
  Fl_Menu_Item *pFVar1;
  undefined1 auVar2 [16];
  Fl_Menu_ *pFVar3;
  int iVar4;
  size_t __n;
  Fl_Menu_Item *__dest;
  Fl_Menu_Item *pFVar5;
  ulong uVar6;
  Fl_Menu_ *o;
  
  pFVar5 = local_array;
  pFVar3 = fl_menu_array_owner;
  if (fl_menu_array_owner != this) {
    if (fl_menu_array_owner != (Fl_Menu_ *)0x0) {
      pFVar1 = fl_menu_array_owner->value_;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)local_array_size;
      __n = SUB168(auVar2 * ZEXT816(0x38),0);
      uVar6 = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0x38),8) == 0) {
        uVar6 = __n;
      }
      __dest = (Fl_Menu_Item *)operator_new__(uVar6);
      pFVar3->menu_ = __dest;
      memcpy(__dest,pFVar5,__n);
      if (pFVar1 != (Fl_Menu_Item *)0x0) {
        pFVar3->value_ = __dest + (int)(((long)pFVar1 - (long)pFVar5) / 0x38);
      }
    }
    if (this->menu_ == (Fl_Menu_Item *)0x0) {
      this->alloc = '\x02';
      pFVar5 = local_array;
      if (local_array == (Fl_Menu_Item *)0x0) {
        local_array_alloc = 0xf;
        pFVar5 = (Fl_Menu_Item *)operator_new__(0x348);
        local_array = pFVar5;
        memset(pFVar5,0,0x348);
      }
      this->menu_ = pFVar5;
      pFVar5->flags = 0;
      pFVar5->labeltype_ = '\0';
      *(undefined3 *)&pFVar5->field_0x25 = 0;
      pFVar5->labelfont_ = 0;
      pFVar5->labelsize_ = 0;
      pFVar5->callback_ = (Fl_Callback *)0x0;
      pFVar5->user_data_ = (void *)0x0;
      pFVar5->text = (char *)0x0;
      *(undefined8 *)&pFVar5->shortcut_ = 0;
      *(undefined8 *)&pFVar5->labelcolor_ = 0;
      local_array_size = 1;
      fl_menu_array_owner = this;
    }
    else {
      if (local_array != (Fl_Menu_Item *)0x0) {
        operator_delete__(local_array);
      }
      if (this->alloc == '\0') {
        copy(this,(EVP_PKEY_CTX *)this->menu_,(EVP_PKEY_CTX *)0x0);
      }
      local_array_size = size(this);
      local_array = this->menu_;
      fl_menu_array_owner = this;
      local_array_alloc = local_array_size;
    }
  }
  iVar4 = Fl_Menu_Item::insert(this->menu_,index,label,shortcut,callback,userdata,flags);
  pFVar1 = local_array;
  pFVar5 = this->menu_;
  this->menu_ = local_array;
  if (this->value_ != (Fl_Menu_Item *)0x0) {
    this->value_ = pFVar1 + (int)(((long)this->value_ - (long)pFVar5) / 0x38);
  }
  return iVar4;
}

Assistant:

int Fl_Menu_::insert(
  int index,
  const char *label,
  int shortcut,
  Fl_Callback *callback,
  void *userdata,
  int flags
) {
  // make this widget own the local array:
  if (this != fl_menu_array_owner) {
    if (fl_menu_array_owner) {
      Fl_Menu_* o = fl_menu_array_owner;
      // the previous owner gets its own correctly-sized array:
      int value_offset = (int) (o->value_-local_array);
      int n = local_array_size;
      Fl_Menu_Item* newMenu = o->menu_ = new Fl_Menu_Item[n];
      memcpy(newMenu, local_array, n*sizeof(Fl_Menu_Item));
      if (o->value_) o->value_ = newMenu+value_offset;
    }
    if (menu_) {
      // this already has a menu array, use it as the local one:
      delete[] local_array;
      if (!alloc) copy(menu_); // duplicate a user-provided static array
      // add to the menu's current array:
      local_array_alloc = local_array_size = size();
      local_array = menu_;
    } else {
      // start with a blank array:
      alloc = 2; // indicates that the strings can be freed
      if (local_array) {
	menu_ = local_array;
      } else {
	local_array_alloc = 15;
	local_array = menu_ = new Fl_Menu_Item[local_array_alloc];
        memset(local_array, 0, sizeof(Fl_Menu_Item) * local_array_alloc);
      }
      memset(menu_, 0, sizeof(Fl_Menu_Item));
      local_array_size = 1;
    }
    fl_menu_array_owner = this;
  }
  int r = menu_->insert(index,label,shortcut,callback,userdata,flags);
  // if it rellocated array we must fix the pointer:
  int value_offset = (int) (value_-menu_);
  menu_ = local_array; // in case it reallocated it
  if (value_) value_ = menu_+value_offset;
  return r;
}